

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Mio_LibraryMatchesStart(Mio_Library_t *pLib,int fPinFilter,int fPinPerm,int fPinQuick)

{
  int iVar1;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar2;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pMVar3;
  
  if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
    if (((pLib->fPinFilter == fPinFilter) && (pLib->fPinPerm == fPinPerm)) &&
       (pLib->fPinQuick == fPinQuick)) {
      return;
    }
    Mio_LibraryMatchesStop(pLib);
  }
  pLib->fPinFilter = fPinFilter;
  pLib->fPinPerm = fPinPerm;
  pLib->fPinQuick = fPinQuick;
  pEntry = (word *)malloc(8);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = 1;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  iVar1 = Abc_PrimeCudd(10000);
  pVVar2 = Vec_IntAlloc(iVar1);
  pVVar2->nSize = iVar1;
  if (pVVar2->pArray != (int *)0x0) {
    memset(pVVar2->pArray,0xff,(long)iVar1 << 2);
  }
  p->vTable = pVVar2;
  pVVar2 = Vec_IntAlloc(10000);
  p->vNexts = pVVar2;
  *pEntry = 0;
  iVar1 = Vec_MemHashInsert(p,pEntry);
  if (iVar1 == 0) {
    *pEntry = 0xaaaaaaaaaaaaaaaa;
    iVar1 = Vec_MemHashInsert(p,pEntry);
    if (iVar1 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    free(pEntry);
    pLib->vTtMem = p;
    p_00 = (Vec_Wec_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    pVVar2 = (Vec_Int_t *)calloc(1000,0x10);
    p_00->pArray = pVVar2;
    pLib->vTt2Match = p_00;
    Vec_WecPushLevel(p_00);
    Vec_WecPushLevel(pLib->vTt2Match);
    if (pLib->vTt2Match->nSize == pLib->vTtMem->nEntries) {
      pMVar3 = Nf_StoDeriveMatches(pLib->vTtMem,pLib->vTt2Match,&pLib->nCells,fPinFilter,fPinPerm,
                                   fPinQuick);
      pLib->pCells = pMVar3;
      return;
    }
    __assert_fail("Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                  ,0x6f0,"void Mio_LibraryMatchesStart(Mio_Library_t *, int, int, int)");
  }
  __assert_fail("Value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
}

Assistant:

void Mio_LibraryMatchesStart( Mio_Library_t * pLib, int fPinFilter, int fPinPerm, int fPinQuick )
{
    extern Mio_Cell2_t * Nf_StoDeriveMatches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, int * pnCells, int fPinFilter, int fPinPerm, int fPinQuick );
    if ( pLib->vTtMem && pLib->fPinFilter == fPinFilter && pLib->fPinPerm == fPinPerm && pLib->fPinQuick == fPinQuick )
        return;
    if ( pLib->vTtMem )
        Mio_LibraryMatchesStop( pLib );
    pLib->fPinFilter = fPinFilter;  // pin filtering
    pLib->fPinPerm   = fPinPerm;    // pin permutation
    pLib->fPinQuick  = fPinQuick;   // pin permutation
    pLib->vTtMem     = Vec_MemAllocForTT( 6, 0 );          
    pLib->vTt2Match  = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( pLib->vTt2Match );
    Vec_WecPushLevel( pLib->vTt2Match );
    assert( Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem) );
    pLib->pCells = Nf_StoDeriveMatches( pLib->vTtMem, pLib->vTt2Match, &pLib->nCells, fPinFilter, fPinPerm, fPinQuick );
}